

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteObjectLibStatement
          (cmNinjaNormalTargetGenerator *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *this_00;
  long *plVar3;
  cmGlobalNinjaGenerator *pcVar4;
  mapped_type *pmVar5;
  cmGeneratedFileStream *os;
  pointer pbVar6;
  cmNinjaBuild build;
  string local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined1 local_178 [24];
  long lStack_160;
  cmNinjaBuild local_150;
  
  local_198._M_allocated_capacity = (size_type)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"phony","");
  paVar1 = &local_150.Comment.field_2;
  local_150.Comment._M_string_length = 0;
  local_150.Comment.field_2._M_local_buf[0] = '\0';
  local_150.Rule._M_dataplus._M_p = (pointer)&local_150.Rule.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_allocated_capacity == &local_188) {
    local_150.Rule.field_2._8_8_ = local_188._8_8_;
  }
  else {
    local_150.Rule._M_dataplus._M_p = (pointer)local_198._M_allocated_capacity;
  }
  local_150.Rule._M_string_length = local_198._8_8_;
  local_198._8_8_ = 0;
  local_188._M_local_buf[0] = '\0';
  p_Var2 = &local_150.Variables._M_t._M_impl.super__Rb_tree_header;
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198._M_allocated_capacity = (size_type)&local_188;
  local_150.Comment._M_dataplus._M_p = (pointer)paVar1;
  memset(&local_150.Outputs,0,0x90);
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_150.RspFile._M_dataplus._M_p = (pointer)&local_150.RspFile.field_2;
  local_150.RspFile._M_string_length = 0;
  local_150.RspFile.field_2._M_local_buf[0] = '\0';
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_1b8,&this->super_cmNinjaTargetGenerator);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x719db2);
  pbVar6 = (pointer)(plVar3 + 2);
  if ((pointer)*plVar3 == pbVar6) {
    local_178._16_8_ = (pbVar6->_M_dataplus)._M_p;
    lStack_160 = plVar3[3];
    local_178._0_8_ = (pointer)(local_178 + 0x10);
  }
  else {
    local_178._16_8_ = (pbVar6->_M_dataplus)._M_p;
    local_178._0_8_ = (pointer)*plVar3;
  }
  local_178._8_8_ = plVar3[1];
  *plVar3 = (long)pbVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_150,(string *)local_178);
  if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_178._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  cmLocalNinjaGenerator::AppendTargetOutputs
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &local_150.Outputs,config);
  target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  this_00 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](&pcVar4->Configs,config);
  cmLocalNinjaGenerator::AppendTargetOutputs
            (this_00,target,&pmVar5->ByproductsForCleanTarget,config);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&local_1b8,&this->super_cmNinjaTargetGenerator,config);
  local_178._16_8_ =
       local_150.ExplicitDeps.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_178._8_8_ =
       local_150.ExplicitDeps.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_178._0_8_ =
       local_150.ExplicitDeps.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_150.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8._M_dataplus._M_p;
  local_150.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._M_string_length;
  local_150.ExplicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_1b8.field_2._M_allocated_capacity;
  local_1b8._M_dataplus._M_p = (pointer)0x0;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b8);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(pcVar4,(ostream *)os,&local_150,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild(&local_150);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            (&local_150.Comment,&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias
            (pcVar4,&local_150.Comment,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.Comment._M_dataplus._M_p != paVar1) {
    operator_delete(local_150.Comment._M_dataplus._M_p,
                    CONCAT71(local_150.Comment.field_2._M_allocated_capacity._1_7_,
                             local_150.Comment.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteObjectLibStatement(
  const std::string& config)
{
  // Write a phony output that depends on all object files.
  {
    cmNinjaBuild build("phony");
    build.Comment = "Object library " + this->GetTargetName();
    this->GetLocalGenerator()->AppendTargetOutputs(this->GetGeneratorTarget(),
                                                   build.Outputs, config);
    this->GetLocalGenerator()->AppendTargetOutputs(
      this->GetGeneratorTarget(),
      this->GetGlobalGenerator()->GetByproductsForCleanTarget(config), config);
    build.ExplicitDeps = this->GetObjects(config);
    this->GetGlobalGenerator()->WriteBuild(this->GetCommonFileStream(), build);
  }

  // Add aliases for the target name.
  this->GetGlobalGenerator()->AddTargetAlias(
    this->GetTargetName(), this->GetGeneratorTarget(), config);
}